

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  undefined **ppuVar1;
  uint32_t uVar2;
  Dim DVar3;
  undefined1 *puVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  SPIRType *pSVar8;
  char *pcVar9;
  long *plVar10;
  undefined8 *puVar11;
  runtime_error *this_00;
  size_type *psVar12;
  undefined **ppuVar13;
  string *in_R8;
  char *pcVar14;
  SPIRType expected_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  string local_1e0;
  SPIRType *local_1c0;
  uint32_t local_1b4;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  uint *local_190;
  size_t local_188;
  uint local_178 [8];
  bool *local_158;
  size_t local_150;
  bool local_140 [24];
  TypedID<(spirv_cross::Types)1> *local_128;
  size_t local_120;
  TypedID<(spirv_cross::Types)1> local_110 [8];
  uint *local_f0;
  size_t local_e8;
  uint local_d8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_98;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  bool *local_38;
  
  uVar2 = (args->base).img.id;
  pSVar8 = (args->base).imgtype;
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = p_forward;
  if ((args->base).is_fetch == true) {
    convert_separate_image_to_expression_abi_cxx11_((string *)local_1b0,this,uVar2);
  }
  else {
    to_expression_abi_cxx11_((string *)local_1b0,this,uVar2,true);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  bVar7 = (this->backend).swizzle_is_function;
  local_1c0 = pSVar8;
  local_1b4 = uVar2;
  bVar6 = should_forward(this,args->coord);
  uVar2 = args->coord_components;
  pSVar8 = Compiler::expression_type(&this->super_Compiler,args->coord);
  pcVar14 = "";
  if (uVar2 != pSVar8->vecsize) {
    if (uVar2 == 1) {
      pcVar14 = ".x";
    }
    else {
      if (uVar2 == 3) {
        pcVar9 = ".xyz()";
        pcVar14 = ".xyz";
      }
      else {
        if (uVar2 != 2) goto LAB_001caf72;
        pcVar9 = ".xy()";
        pcVar14 = ".xy";
      }
      if (bVar7 != false) {
        pcVar14 = pcVar9;
      }
    }
  }
LAB_001caf72:
  if (*pcVar14 == '\0') {
    to_expression_abi_cxx11_(&local_60,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_((string *)local_1b0,this,args->coord,true);
    plVar10 = (long *)::std::__cxx11::string::append(local_1b0);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_60.field_2._M_allocated_capacity = *psVar12;
      local_60.field_2._8_8_ = plVar10[3];
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar12;
      local_60._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_60._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  pSVar8 = Compiler::expression_type(&this->super_Compiler,args->coord);
  if (*(int *)&(pSVar8->super_IVariant).field_0xc == 8) {
    SPIRType::SPIRType((SPIRType *)local_1b0,pSVar8);
    local_1a0._M_allocated_capacity._4_4_ = args->coord_components;
    local_1b0._12_4_ = 7;
    in_R8 = &local_60;
    bitcast_expression(&local_1e0,this,(SPIRType *)local_1b0,
                       *(BaseType *)&(pSVar8->super_IVariant).field_0xc,in_R8);
    ::std::__cxx11::string::operator=((string *)&local_60,(string *)&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    local_1b0._0_8_ = &PTR__SPIRType_003574a8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_98);
    local_e8 = 0;
    if (local_f0 != local_d8) {
      free(local_f0);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    local_150 = 0;
    if (local_158 != local_140) {
      free(local_158);
    }
    local_188 = 0;
    if (local_190 != local_178) {
      free(local_190);
    }
  }
  DVar3 = (local_1c0->image).dim;
  if (((byte)(DVar3 == DimCube | DVar3 == Dim2D & (local_1c0->image).arrayed) == 1) &&
     (bVar7 = Compiler::image_is_comparison(&this->super_Compiler,local_1c0,local_1b4), bVar7)) {
    bVar7 = args->lod != 0;
  }
  else {
    bVar7 = false;
  }
  if (args->dref == 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  }
  else {
    if (bVar6) {
      bVar6 = should_forward(this,args->dref);
    }
    else {
      bVar6 = false;
    }
    if (((args->base).is_gather == false) && (args->coord_components != 4)) {
      if ((args->base).is_proj == true) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        DVar3 = (local_1c0->image).dim;
        if (DVar3 == Dim2D) {
          to_enclosed_expression_abi_cxx11_(&local_1e0,this,args->coord,true);
          plVar10 = (long *)::std::__cxx11::string::append((char *)&local_1e0);
          ppuVar1 = (undefined **)(local_1b0 + 0x10);
          ppuVar13 = (undefined **)(plVar10 + 2);
          if ((undefined **)*plVar10 == ppuVar13) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1a0._8_8_ = plVar10[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1b0._0_8_ = (undefined **)*plVar10;
          }
          local_1b0._8_8_ = plVar10[1];
          *plVar10 = (long)ppuVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_enclosed_expression_abi_cxx11_(&local_1e0,this,args->coord,true);
          plVar10 = (long *)::std::__cxx11::string::append((char *)&local_1e0);
          ppuVar13 = (undefined **)(plVar10 + 2);
          if ((undefined **)*plVar10 == ppuVar13) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1a0._8_8_ = plVar10[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1b0._0_8_ = (undefined **)*plVar10;
          }
          local_1b0._8_8_ = plVar10[1];
          *plVar10 = (long)ppuVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        }
        else {
          if (DVar3 != Dim1D) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1b0._0_8_ = local_1b0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"Invalid type for textureProj with shadow.","");
            ::std::runtime_error::runtime_error(this_00,(string *)local_1b0);
            *(undefined ***)this_00 = &PTR__runtime_error_00357118;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_(&local_1e0,this,args->coord,true);
          plVar10 = (long *)::std::__cxx11::string::append((char *)&local_1e0);
          ppuVar1 = (undefined **)(local_1b0 + 0x10);
          ppuVar13 = (undefined **)(plVar10 + 2);
          if ((undefined **)*plVar10 == ppuVar13) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1a0._8_8_ = plVar10[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1b0._0_8_ = (undefined **)*plVar10;
          }
          local_1b0._8_8_ = plVar10[1];
          *plVar10 = (long)ppuVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_enclosed_expression_abi_cxx11_(&local_1e0,this,args->coord,true);
          puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1e0);
          ppuVar13 = (undefined **)(puVar11 + 2);
          if ((undefined **)*puVar11 == ppuVar13) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1a0._8_8_ = puVar11[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar13;
            local_1b0._0_8_ = (undefined **)*puVar11;
          }
          local_1b0._8_8_ = puVar11[1];
          *puVar11 = ppuVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_001cb757;
      }
      else {
        pSVar8 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType((SPIRType *)local_1b0,pSVar8);
        local_1a0._M_allocated_capacity._4_4_ = args->coord_components + 1;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_to_glsl_constructor_abi_cxx11_(&local_1e0,this,(SPIRType *)local_1b0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_(&local_1e0,this,args->dref,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_1b0._0_8_ = &PTR__SPIRType_003574a8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_98);
        local_e8 = 0;
        if (local_f0 != local_d8) {
          free(local_f0);
        }
        local_120 = 0;
        if (local_128 != local_110) {
          free(local_128);
        }
        local_150 = 0;
        if (local_158 != local_140) {
          free(local_158);
        }
        local_188 = 0;
        if (local_190 != local_178) {
          free(local_190);
        }
      }
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_1b0,this,args->coord,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      local_1e0._M_dataplus._M_p = (pointer)local_1b0._0_8_;
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
LAB_001cb757:
        operator_delete(local_1e0._M_dataplus._M_p);
      }
    }
  }
  if (args->grad_y != 0 || args->grad_x != 0) {
    if ((bVar6 == false) || (bVar6 = should_forward(this,args->grad_x), !bVar6)) {
      bVar6 = false;
    }
    else {
      bVar6 = should_forward(this,args->grad_y);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->grad_x,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->grad_y,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->lod == 0) {
    if ((((args->base).is_fetch == true) && ((local_1c0->image).dim != DimBuffer)) &&
       ((local_1c0->image).ms == false)) {
LAB_001cb8b5:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else if (bVar7) {
    DVar3 = (local_1c0->image).dim;
    if ((DVar3 == Dim2D) || (DVar3 == DimCube)) goto LAB_001cb8b5;
  }
  else {
    bVar7 = check_explicit_lod_allowed(this,args->lod);
    if (bVar7) {
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = should_forward(this,args->lod);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pSVar8 = Compiler::expression_type(&this->super_Compiler,args->lod);
      if ((((args->base).is_fetch == true) && ((local_1c0->image).dim != DimBuffer)) &&
         (((local_1c0->image).ms == false && (*(int *)&(pSVar8->super_IVariant).field_0xc != 7)))) {
        to_expression_abi_cxx11_(&local_1e0,this,args->lod,true);
        join<char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_1b0,(spirv_cross *)0x2e02a4,(char (*) [5])&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,
                   (char (*) [2])in_R8);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        psVar5 = &local_1e0;
      }
      else {
        to_expression_abi_cxx11_((string *)local_1b0,this,args->lod,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        psVar5 = (string *)local_1b0;
      }
      puVar4 = (undefined1 *)(&(psVar5->field_2)._M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4 != &psVar5->field_2) {
        operator_delete(puVar4);
      }
    }
  }
  if (args->coffset == 0) {
    if (args->offset == 0) goto LAB_001cb9f4;
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = should_forward(this,args->offset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->offset,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
  }
  else {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = should_forward(this,args->coffset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->coffset,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
LAB_001cb9f4:
  if (args->sample != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->sample,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->min_lod,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->sparse_texel,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->bias != 0) {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = should_forward(this,args->bias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->bias,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->component != 0) {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = should_forward(this,args->component);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->component,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  *local_38 = bVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_expression(img);

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    image_is_comparison(imgtype, img) && args.lod != 0;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";
			farg_str += coord_expr;
			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			if (check_explicit_lod_allowed(args.lod))
			{
				forward = forward && should_forward(args.lod);
				farg_str += ", ";

				auto &lod_expr_type = expression_type(args.lod);

				// Lod expression for TexelFetch in GLSL must be int, and only int.
				if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms &&
				    lod_expr_type.basetype != SPIRType::Int)
				{
					farg_str += join("int(", to_expression(args.lod), ")");
				}
				else
				{
					farg_str += to_expression(args.lod);
				}
			}
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += to_expression(args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += to_expression(args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component)
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += to_expression(args.component);
	}

	*p_forward = forward;

	return farg_str;
}